

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O0

void __thiscall wabt::OptionParser::Parse(OptionParser *this,int argc,char **argv)

{
  char *arg_value;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Option *pOVar5;
  reference pvVar6;
  ulong uVar7;
  undefined8 uVar8;
  reference pOVar9;
  reference pvVar10;
  size_type sVar11;
  ulong local_a8;
  size_t i_1;
  char *option_argument_1;
  Option *option_1;
  iterator __end4;
  iterator __begin4;
  vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_> *__range4;
  bool matched;
  char *pcStack_70;
  int k;
  char *option_argument;
  Option *best_option;
  int match_length;
  Option *option;
  size_t j;
  int local_40;
  int best_count;
  int best_length;
  int best_index;
  char *arg;
  int i;
  bool processing_options;
  size_t arg_index;
  char **argv_local;
  OptionParser *pOStack_10;
  int argc_local;
  OptionParser *this_local;
  
  _i = 0;
  bVar3 = true;
  arg._0_4_ = 1;
  arg_index = (size_t)argv;
  argv_local._4_4_ = argc;
  pOStack_10 = this;
  do {
    if (argv_local._4_4_ <= (int)arg) {
      bVar3 = std::
              vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>::
              empty(&this->arguments_);
      if ((!bVar3) &&
         (pvVar10 = std::
                    vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
                    ::back(&this->arguments_), pvVar10->handled_count == 0)) {
        for (local_a8 = _i;
            sVar11 = std::
                     vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
                     ::size(&this->arguments_), local_a8 < sVar11; local_a8 = local_a8 + 1) {
          pvVar10 = std::
                    vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
                    ::operator[](&this->arguments_,local_a8);
          if (pvVar10->count != ZeroOrMore) {
            std::vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
            ::operator[](&this->arguments_,local_a8);
            uVar8 = std::__cxx11::string::c_str();
            Errorf(this,"expected %s argument.",uVar8);
          }
        }
      }
      return;
    }
    arg_value = *(char **)(arg_index + (long)(int)arg * 8);
    if ((bVar3) && (*arg_value == '-')) {
      if (arg_value[1] == '-') {
        if (arg_value[2] == '\0') {
          bVar3 = false;
        }
        else {
          best_count = -1;
          local_40 = 0;
          j._4_4_ = 0;
          for (option = (Option *)0x0;
              pOVar5 = (Option *)
                       std::
                       vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
                       ::size(&this->options_), option < pOVar5;
              option = (Option *)&option->field_0x1) {
            pvVar6 = std::
                     vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
                     ::operator[](&this->options_,(size_type)option);
            uVar7 = std::__cxx11::string::empty();
            if ((uVar7 & 1) == 0) {
              iVar4 = Match(arg_value + 2,&pvVar6->long_name,(bool)(pvVar6->has_argument & 1));
              if (local_40 < iVar4) {
                best_count = (int)option;
                j._4_4_ = 1;
                local_40 = iVar4;
              }
              else if ((iVar4 == local_40) && (0 < local_40)) {
                j._4_4_ = j._4_4_ + 1;
              }
            }
          }
          if (j._4_4_ < 2) {
            if (j._4_4_ == 0) {
              Errorf(this,"unknown option \'%s\'",arg_value);
            }
            else {
              pvVar6 = std::
                       vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
                       ::operator[](&this->options_,(long)best_count);
              pcStack_70 = (char *)0x0;
              if ((pvVar6->has_argument & 1U) != 0) {
                if ((arg_value[local_40 + 1] == '\0') || (arg_value[local_40 + 2] != '=')) {
                  if (((int)arg + 1 == argv_local._4_4_) ||
                     (**(char **)(arg_index + (long)((int)arg + 1) * 8) == '-')) {
                    uVar8 = std::__cxx11::string::c_str();
                    Errorf(this,"option \'--%s\' requires argument",uVar8);
                    goto LAB_001dbd66;
                  }
                  arg._0_4_ = (int)arg + 1;
                  pcStack_70 = *(char **)(arg_index + (long)(int)arg * 8);
                }
                else {
                  pcStack_70 = arg_value + (local_40 + 3);
                }
              }
              std::function<void_(const_char_*)>::operator()(&pvVar6->callback,pcStack_70);
            }
          }
          else {
            Errorf(this,"ambiguous option \'%s\'",arg_value);
          }
        }
      }
      else if (arg_value[1] == '\0') {
        HandleArgument(this,(size_t *)&i,arg_value);
      }
      else {
        for (__range4._4_4_ = 1; arg_value[__range4._4_4_] != '\0';
            __range4._4_4_ = __range4._4_4_ + 1) {
          bVar1 = false;
          __end4 = std::
                   vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>::
                   begin(&this->options_);
          option_1 = (Option *)
                     std::
                     vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
                     ::end(&this->options_);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<wabt::OptionParser::Option_*,_std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>_>
                                             *)&option_1), bVar2) {
            pOVar9 = __gnu_cxx::
                     __normal_iterator<wabt::OptionParser::Option_*,_std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>_>
                     ::operator*(&__end4);
            if ((pOVar9->short_name != '\0') && (arg_value[__range4._4_4_] == pOVar9->short_name)) {
              i_1 = 0;
              if ((pOVar9->has_argument & 1U) != 0) {
                if (arg_value[__range4._4_4_ + 1] != '\0') {
                  Errorf(this,"option \'-%c\' requires argument",
                         (ulong)(uint)(int)pOVar9->short_name);
                  break;
                }
                if (((int)arg + 1 == argv_local._4_4_) ||
                   (**(char **)(arg_index + (long)((int)arg + 1) * 8) == '-')) {
                  Errorf(this,"option \'-%c\' requires argument",
                         (ulong)(uint)(int)pOVar9->short_name);
                  break;
                }
                arg._0_4_ = (int)arg + 1;
                i_1 = *(size_t *)(arg_index + (long)(int)arg * 8);
              }
              std::function<void_(const_char_*)>::operator()(&pOVar9->callback,(char *)i_1);
              bVar1 = true;
              break;
            }
            __gnu_cxx::
            __normal_iterator<wabt::OptionParser::Option_*,_std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>_>
            ::operator++(&__end4);
          }
          if (!bVar1) {
            Errorf(this,"unknown option \'-%c\'",(ulong)(uint)(int)arg_value[__range4._4_4_]);
          }
        }
      }
    }
    else {
      HandleArgument(this,(size_t *)&i,arg_value);
    }
LAB_001dbd66:
    arg._0_4_ = (int)arg + 1;
  } while( true );
}

Assistant:

void OptionParser::Parse(int argc, char* argv[]) {
  size_t arg_index = 0;
  bool processing_options = true;

  for (int i = 1; i < argc; ++i) {
    const char* arg = argv[i];
    if (!processing_options || arg[0] != '-') {
      // Non-option argument.
      HandleArgument(&arg_index, arg);
      continue;
    }

    if (arg[1] == '-') {
      if (arg[2] == '\0') {
        // -- on its own means stop processing args, everything should
        // be treated as positional.
        processing_options = false;
        continue;
      }
      // Long option.
      int best_index = -1;
      int best_length = 0;
      int best_count = 0;
      for (size_t j = 0; j < options_.size(); ++j) {
        const Option& option = options_[j];
        if (!option.long_name.empty()) {
          int match_length =
              Match(&arg[2], option.long_name, option.has_argument);
          if (match_length > best_length) {
            best_index = j;
            best_length = match_length;
            best_count = 1;
          } else if (match_length == best_length && best_length > 0) {
            best_count++;
          }
        }
      }

      if (best_count > 1) {
        Errorf("ambiguous option '%s'", arg);
        continue;
      } else if (best_count == 0) {
        Errorf("unknown option '%s'", arg);
        continue;
      }

      const Option& best_option = options_[best_index];
      const char* option_argument = nullptr;
      if (best_option.has_argument) {
        if (arg[best_length + 1] != 0 &&    // This byte is 0 on a full match.
            arg[best_length + 2] == '=') {  // +2 to skip "--".
          option_argument = &arg[best_length + 3];
        } else {
          if (i + 1 == argc || argv[i + 1][0] == '-') {
            Errorf("option '--%s' requires argument",
                   best_option.long_name.c_str());
            continue;
          }
          ++i;
          option_argument = argv[i];
        }
      }
      best_option.callback(option_argument);
    } else {
      // Short option.
      if (arg[1] == '\0') {
        // Just "-".
        HandleArgument(&arg_index, arg);
        continue;
      }

      // Allow short names to be combined, e.g. "-d -v" => "-dv".
      for (int k = 1; arg[k]; ++k) {
        bool matched = false;
        for (const Option& option : options_) {
          if (option.short_name && arg[k] == option.short_name) {
            const char* option_argument = nullptr;
            if (option.has_argument) {
              // A short option with a required argument cannot be followed
              // by other short options_.
              if (arg[k + 1] != '\0') {
                Errorf("option '-%c' requires argument", option.short_name);
                break;
              }

              if (i + 1 == argc || argv[i + 1][0] == '-') {
                Errorf("option '-%c' requires argument", option.short_name);
                break;
              }
              ++i;
              option_argument = argv[i];
            }
            option.callback(option_argument);
            matched = true;
            break;
          }
        }

        if (!matched) {
          Errorf("unknown option '-%c'", arg[k]);
          continue;
        }
      }
    }
  }

  // For now, all arguments must be provided. Check that the last Argument was
  // handled at least once.
  if (!arguments_.empty() && arguments_.back().handled_count == 0) {
    for (size_t i = arg_index; i < arguments_.size(); ++i) {
      if (arguments_[i].count != ArgumentCount::ZeroOrMore) {
        Errorf("expected %s argument.", arguments_[i].name.c_str());
      }
    }
  }
}